

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputFlateDecodeStream.cpp
# Opt level: O3

LongBufferSizeType __thiscall
OutputFlateDecodeStream::Write
          (OutputFlateDecodeStream *this,Byte *inBuffer,LongBufferSizeType inSize)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Trace *pTVar3;
  z_stream *strm;
  LongBufferSizeType LVar4;
  
  if (this->mCurrentlyEncoding != true) {
    if (this->mTargetStream != (IByteWriter *)0x0) {
      iVar1 = (*this->mTargetStream->_vptr_IByteWriter[2])();
      return CONCAT44(extraout_var,iVar1);
    }
    return 0;
  }
  if (inSize == 0) {
    LVar4 = 0;
  }
  else {
    strm = this->mZLibState;
    strm->avail_in = (uInt)inSize;
    strm->next_in = inBuffer;
    do {
      strm->avail_out = 0x40000;
      strm->next_out = this->mBuffer;
      uVar2 = inflate(strm,0);
      if ((uVar2 + 4 < 7) && ((0x47U >> (uVar2 + 4 & 0x1f) & 1) != 0)) {
        pTVar3 = Trace::DefaultTrace();
        Trace::TraceToLog(pTVar3,
                          "OutputFlateDecodeStream::DecodeBufferAndWrite, failed to write zlib information. returned error code = %d"
                          ,(ulong)uVar2);
        inflateEnd(this->mZLibState);
        break;
      }
      iVar1 = (*this->mTargetStream->_vptr_IByteWriter[2])
                        (this->mTargetStream,this->mBuffer,
                         (ulong)(0x40000 - this->mZLibState->avail_out));
      strm = this->mZLibState;
      if (CONCAT44(extraout_var_00,iVar1) != (ulong)(0x40000 - strm->avail_out)) {
        pTVar3 = Trace::DefaultTrace();
        Trace::TraceToLog(pTVar3,
                          "OutputFlateDecodeStream::DecodeBufferAndWrite, Failed to write the desired amount of zlib bytes to underlying stream. supposed to write %lld, wrote %lld"
                          ,(ulong)(0x40000 - this->mZLibState->avail_out),
                          CONCAT44(extraout_var_00,iVar1));
        inflateEnd(this->mZLibState);
        this->mCurrentlyEncoding = false;
        return 0;
      }
    } while (strm->avail_out == 0);
    LVar4 = 0;
    if (uVar2 < 2) {
      LVar4 = inSize;
    }
  }
  return LVar4;
}

Assistant:

LongBufferSizeType OutputFlateDecodeStream::Write(const IOBasicTypes::Byte* inBuffer,LongBufferSizeType inSize)
{
	if(mCurrentlyEncoding)
		return DecodeBufferAndWrite(inBuffer,inSize);
	else if(mTargetStream)
		return mTargetStream->Write(inBuffer,inSize);
	else
		return 0;
}